

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O2

bool __thiscall Lexer::Error(Lexer *this,string *message,string *err)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  int len;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  string local_460;
  string *local_440;
  char buf [1024];
  
  pcVar3 = (this->input_).str_;
  pcVar2 = this->last_token_;
  uVar4 = 1;
  pcVar6 = pcVar3;
  while (pcVar3 < pcVar2) {
    cVar1 = *pcVar3;
    pcVar3 = pcVar3 + 1;
    if (cVar1 == '\n') {
      pcVar6 = pcVar3;
    }
    uVar4 = uVar4 + (cVar1 == '\n');
  }
  iVar7 = (int)pcVar2 - (int)pcVar6;
  if (pcVar2 == (char *)0x0) {
    iVar7 = 0;
  }
  local_440 = message;
  StringPiece::AsString_abi_cxx11_(&local_460,&this->filename_);
  snprintf(buf,0x400,"%s:%d: ",local_460._M_dataplus._M_p,(ulong)uVar4);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::assign((char *)err);
  std::operator+(&local_460,local_440,"\n");
  std::__cxx11::string::append((string *)err);
  std::__cxx11::string::~string((string *)&local_460);
  if (iVar7 - 1U < 0x47) {
    for (uVar5 = 0; ((uVar5 != 0x48 && (pcVar6[uVar5] != '\0')) && (pcVar6[uVar5] != '\n'));
        uVar5 = uVar5 + 1) {
    }
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,pcVar6,pcVar6 + uVar5);
    std::__cxx11::string::append((string *)err);
    std::__cxx11::string::~string((string *)&local_460);
    if (0x47 < uVar5) {
      std::__cxx11::string::append((char *)err);
    }
    std::__cxx11::string::append((char *)err);
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_460,(char)iVar7);
    std::__cxx11::string::append((string *)err);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::append((char *)err);
  }
  return false;
}

Assistant:

bool Lexer::Error(const string& message, string* err) {
  // Compute line/column.
  int line = 1;
  const char* line_start = input_.str_;
  for (const char* p = input_.str_; p < last_token_; ++p) {
    if (*p == '\n') {
      ++line;
      line_start = p + 1;
    }
  }
  int col = last_token_ ? (int)(last_token_ - line_start) : 0;

  char buf[1024];
  snprintf(buf, sizeof(buf), "%s:%d: ", filename_.AsString().c_str(), line);
  *err = buf;
  *err += message + "\n";

  // Add some context to the message.
  const int kTruncateColumn = 72;
  if (col > 0 && col < kTruncateColumn) {
    int len;
    bool truncated = true;
    for (len = 0; len < kTruncateColumn; ++len) {
      if (line_start[len] == 0 || line_start[len] == '\n') {
        truncated = false;
        break;
      }
    }
    *err += string(line_start, len);
    if (truncated)
      *err += "...";
    *err += "\n";
    *err += string(col, ' ');
    *err += "^ near here";
  }

  return false;
}